

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

bool __thiscall
Timidity::Renderer::start_region(Renderer *this,int chan,int note,int vel,Sample *sp,float f)

{
  Voice *v;
  char cVar1;
  SDWORD SVar2;
  float fVar3;
  uint i;
  Renderer *this_00;
  double dVar4;
  
  this_00 = this;
  i = allocate_voice(this);
  if ((int)i < 0) goto LAB_00370855;
  v = this->voice + i;
  this->voice[i].sample = sp;
  if (sp->type != '\0') {
    if (sp->scale_factor == 0x400) {
      dVar4 = (double)note;
      if (sp->tune != 0) {
        dVar4 = (double)(int)sp->tune * 0.01 + dVar4;
      }
      dVar4 = exp2(dVar4 * 0.08333333333333333);
      f = (float)(dVar4 * 8175.798947309669);
    }
    else {
      f = calculate_scaled_frequency(this_00,sp,note);
    }
  }
  v->orig_frequency = f;
  v->status = '\x01';
  v->channel = (BYTE)chan;
  v->note = (BYTE)note;
  v->velocity = (BYTE)vel;
  v->sample_offset = 0;
  v->sample_increment = 0;
  v->sample_count = 0;
  v->tremolo_phase = 0;
  v->tremolo_sweep = sp->tremolo_sweep_increment;
  v->tremolo_sweep_position = 0;
  SVar2 = sp->vibrato_sweep_increment;
  v->tremolo_phase_increment = sp->tremolo_phase_increment;
  v->vibrato_sweep = SVar2;
  v->vibrato_sweep_position = 0;
  v->vibrato_control_ratio = sp->vibrato_control_ratio;
  v->vibrato_phase = 0;
  v->vibrato_control_counter = 0;
  kill_key_group(this,i);
  v->vibrato_sample_increment[0x1c] = 0;
  v->vibrato_sample_increment[0x1d] = 0;
  v->vibrato_sample_increment[0x1e] = 0;
  v->vibrato_sample_increment[0x1f] = 0;
  v->vibrato_sample_increment[0x18] = 0;
  v->vibrato_sample_increment[0x19] = 0;
  v->vibrato_sample_increment[0x1a] = 0;
  v->vibrato_sample_increment[0x1b] = 0;
  v->vibrato_sample_increment[0x14] = 0;
  v->vibrato_sample_increment[0x15] = 0;
  v->vibrato_sample_increment[0x16] = 0;
  v->vibrato_sample_increment[0x17] = 0;
  v->vibrato_sample_increment[0x10] = 0;
  v->vibrato_sample_increment[0x11] = 0;
  v->vibrato_sample_increment[0x12] = 0;
  v->vibrato_sample_increment[0x13] = 0;
  v->vibrato_sample_increment[0xc] = 0;
  v->vibrato_sample_increment[0xd] = 0;
  v->vibrato_sample_increment[0xe] = 0;
  v->vibrato_sample_increment[0xf] = 0;
  v->vibrato_sample_increment[8] = 0;
  v->vibrato_sample_increment[9] = 0;
  v->vibrato_sample_increment[10] = 0;
  v->vibrato_sample_increment[0xb] = 0;
  v->vibrato_sample_increment[4] = 0;
  v->vibrato_sample_increment[5] = 0;
  v->vibrato_sample_increment[6] = 0;
  v->vibrato_sample_increment[7] = 0;
  v->vibrato_sample_increment[0] = 0;
  v->vibrato_sample_increment[1] = 0;
  v->vibrato_sample_increment[2] = 0;
  v->vibrato_sample_increment[3] = 0;
  cVar1 = this->channel[chan].panning;
  if (sp->type == 2) {
    if (cVar1 == -1) {
      dVar4 = (double)(sp->panning + 500) * 0.001;
    }
    else {
      dVar4 = (double)(int)sp->panning * 0.001 + (double)(int)cVar1 * 0.0078125;
    }
LAB_00370808:
    compute_pan(dVar4,(uint)sp->type,&v->left_offset,&v->right_offset);
  }
  else {
    if (cVar1 != -1) {
      dVar4 = (double)(int)cVar1 * 0.0078125;
      goto LAB_00370808;
    }
    fVar3 = v->sample->right_offset;
    v->left_offset = v->sample->left_offset;
    v->right_offset = fVar3;
  }
  recompute_freq(this,i);
  recompute_amp(this,v);
  v->control_counter = 0;
  Envelope::Init(&v->eg1,this,v);
  if ((v->sample->modes & 4) != 0) {
    v->status = v->status | 0x10;
  }
LAB_00370855:
  return -1 < (int)i;
}

Assistant:

bool Renderer::start_region(int chan, int note, int vel, Sample *sp, float f)
{
	int voicenum;
	Voice *v;

	voicenum = allocate_voice();
	if (voicenum < 0)
	{
		return false;
	}
	v = &voice[voicenum];
	v->sample = sp;

	if (sp->type == INST_GUS)
	{
		v->orig_frequency = f;
	}
	else
	{
		if (sp->scale_factor != 1024)
		{
			v->orig_frequency = calculate_scaled_frequency(sp, note);
		}
		else if (sp->tune != 0)
		{
			v->orig_frequency = note_to_freq(note + sp->tune * 0.01);
		}
		else
		{
			v->orig_frequency = note_to_freq(note);
		}
	}

	v->status = VOICE_RUNNING;
	v->channel = chan;
	v->note = note;
	v->velocity = vel;
	v->sample_offset = 0;
	v->sample_increment = 0; /* make sure it isn't negative */
	v->sample_count = 0;

	v->tremolo_phase = 0;
	v->tremolo_phase_increment = v->sample->tremolo_phase_increment;
	v->tremolo_sweep = v->sample->tremolo_sweep_increment;
	v->tremolo_sweep_position = 0;

	v->vibrato_sweep = v->sample->vibrato_sweep_increment;
	v->vibrato_sweep_position = 0;
	v->vibrato_control_ratio = v->sample->vibrato_control_ratio;
	v->vibrato_control_counter = v->vibrato_phase = 0;

	kill_key_group(voicenum);

	memset(v->vibrato_sample_increment, 0, sizeof(v->vibrato_sample_increment));

	if (sp->type == INST_SF2)
	{
		// Channel pan is added to instrument pan.
		double pan;
		if (channel[chan].panning == NO_PANNING)
		{
			pan = (sp->panning + 500) / 1000.0;
		}
		else
		{
			pan = channel[chan].panning / 128.0 + sp->panning / 1000.0;
		}
		compute_pan(pan, sp->type, v->left_offset, v->right_offset);
	}
	else if (channel[chan].panning != NO_PANNING)
	{
		compute_pan(channel[chan].panning / 128.0, sp->type, v->left_offset, v->right_offset);
	}
	else
	{
		v->left_offset = v->sample->left_offset;
		v->right_offset = v->sample->right_offset;
	}

	recompute_freq(voicenum);
	recompute_amp(v);
	v->control_counter = 0;

	v->eg1.Init(this, v);

	if (v->sample->modes & PATCH_LOOPEN)
	{
		v->status |= VOICE_LPE;
	}
	return true;
}